

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O1

void __thiscall QtMWidgets::DateTimeParser::DateTimeParser(DateTimeParser *this,Type t)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QByteArrayView QVar4;
  QString local_48;
  QArrayData *local_30;
  char16_t *local_28;
  qsizetype qStack_20;
  
  this->_vptr_DateTimeParser = (_func_int **)&PTR__DateTimeParser_00196bc8;
  (this->sections).d.d = (Data *)0x0;
  (this->sections).d.ptr = (Section *)0x0;
  (this->sections).d.size = 0;
  this->type = t;
  (this->format).d.d = (Data *)0x0;
  (this->format).d.ptr = (char16_t *)0x0;
  (this->format).d.size = 0;
  local_48.d.size = 0;
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  QVar4.m_data = (storage_type *)0x14;
  QVar4.m_size = (qsizetype)&local_30;
  QString::fromLatin1(QVar4);
  qVar3 = local_48.d.size;
  pcVar2 = local_48.d.ptr;
  pDVar1 = local_48.d.d;
  local_48.d.d = (Data *)local_30;
  local_30 = &pDVar1->super_QArrayData;
  local_48.d.ptr = local_28;
  local_48.d.size = qStack_20;
  local_28 = pcVar2;
  qStack_20 = qVar3;
  if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar1->super_QArrayData,2,8);
    }
  }
  parseFormat(this,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
    }
  }
  return;
}

Assistant:

DateTimeParser::DateTimeParser( QMetaType::Type t )
	:	type( t )
{
	parseFormat( QLatin1String( "dddd MMMM yyyy hh mm" ) );
}